

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpmemoryobject.h
# Opt level: O1

void __thiscall
jrtplib::RTCPCompoundPacket::RTCPCompoundPacket(RTCPCompoundPacket *this,RTPMemoryManager *mgr)

{
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_00142aa0;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->rtcppacklist;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->rtcppacklist;
  this->error = 0;
  this->compoundpacket = (uint8_t *)0x0;
  this->compoundpacketlength = 0;
  (this->rtcppacklist).
  super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->rtcppackit)._M_node = (_List_node_base *)0x0;
  this->deletepacket = true;
  return;
}

Assistant:

RTPMemoryObject(RTPMemoryManager *memmgr) : mgr(memmgr)			{ }